

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::IfExceptExpr::IfExceptExpr(IfExceptExpr *this,Location *loc)

{
  Location local_48;
  Location *local_18;
  Location *loc_local;
  IfExceptExpr *this_local;
  
  local_18 = loc;
  loc_local = (Location *)this;
  ExprMixin<(wabt::ExprType)20>::ExprMixin(&this->super_ExprMixin<(wabt::ExprType)20>,loc);
  (this->super_ExprMixin<(wabt::ExprType)20>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__IfExceptExpr_01e54198;
  Block::Block(&this->true_);
  intrusive_list<wabt::Expr>::intrusive_list(&this->false_);
  Location::Location(&this->false_end_loc);
  Location::Location(&local_48);
  Var::Var(&this->except_var,0xffffffff,&local_48);
  return;
}

Assistant:

explicit IfExceptExpr(const Location& loc = Location())
      : ExprMixin<ExprType::IfExcept>(loc) {}